

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>_>
::disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::~AdapterPromiseNode
              ((AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *)pointer);
  }
  operator_delete(pointer,0x230);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }